

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O3

bool __thiscall
DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
          (DynamicProfileStorageReaderWriter *this,uint *t,size_t len)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  size_t sVar5;
  PAL_FILE *f;
  
  f = this->file;
  if (f == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x5d,"(file)","file");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    f = this->file;
  }
  uVar3 = PAL_ftell(f);
  sVar5 = PAL_fread(t,4,len,this->file);
  if (sVar5 != len) {
    Output::Print(L"ERROR: DynamicProfileStorage: \'%s\': File corrupted at %d\n",this->filename,
                  (ulong)uVar3);
    Output::Flush();
  }
  return sVar5 == len;
}

Assistant:

bool DynamicProfileStorageReaderWriter::ReadArray(T * t, size_t len)
{
    AssertOrFailFast(file);
    int32 pos = ftell(file);
    if (fread(t, sizeof(T), len, file) != len)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: '%s': File corrupted at %d\n"), filename, pos);
        Output::Flush();
        return false;
    }
    return true;
}